

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O0

void __thiscall Mapper004::handleScanline(Mapper004 *this)

{
  Console *this_00;
  long in_RDI;
  Console *c;
  
  if (*(char *)(in_RDI + 0x14) == '\0') {
    *(undefined1 *)(in_RDI + 0x14) = *(undefined1 *)(in_RDI + 0x13);
  }
  else {
    *(char *)(in_RDI + 0x14) = *(char *)(in_RDI + 0x14) + -1;
    if ((*(char *)(in_RDI + 0x14) == '\0') && ((*(byte *)(in_RDI + 0x10) & 1) != 0)) {
      this_00 = Console::Instance();
      Console::getCPU(this_00);
      CPU::IRQ((CPU *)this_00);
    }
  }
  return;
}

Assistant:

void Mapper004::handleScanline() {
    if (counter == 0) {
        counter = reloadVal;
    } else {
        counter--;
        if (counter == 0 && irqEnabled) {
            Console &c = Console::Instance();
            c.getCPU()->IRQ();
        }
    }
}